

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O2

LR des_round(LR in,des_keysched *sched,size_t round)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar3 = in.R;
  uVar4 = (uVar3 << 4 | uVar3 >> 0x1c) ^ sched->k6420[round];
  uVar3 = sched->k7531[round] ^ uVar3;
  uVar8 = uVar4 & 0xfc00fc | 0xff00ff00;
  uVar9 = uVar4 >> 8 & 0xfc00fc | 0xff00ff00;
  uVar10 = uVar3 & 0xfc00fc | 0xff00ff00;
  uVar11 = uVar3 >> 8 & 0xfc00fc | 0xff00ff00;
  uVar5 = 0;
  uVar2 = 0;
  uVar6 = 0;
  uVar7 = 0;
  for (uVar1 = 0; uVar1 < 0x200; uVar1 = uVar1 + 0x10) {
    uVar5 = uVar5 ^ *(uint *)(des_S_tbl + uVar1) & uVar8;
    uVar2 = uVar2 ^ *(uint *)(des_S_tbl + uVar1 + 4) & uVar9;
    uVar6 = uVar6 ^ *(uint *)(des_S_tbl + uVar1 + 8) & uVar10;
    uVar7 = uVar7 ^ *(uint *)(des_S_tbl + uVar1 + 0xc) & uVar11;
    uVar8 = uVar8 + 0x80008;
    uVar9 = uVar9 + 0x80008;
    uVar10 = uVar10 + 0x80008;
    uVar11 = uVar11 + 0x80008;
  }
  uVar2 = ((uVar3 & 0x40004) * 0x3c00 & uVar6 << 4 ^ uVar6) >> 8 & 0xf000f0 |
          ((uVar4 >> 8 & 0x40004) * 0x3c00 & uVar2 << 4 ^ uVar2) >> 4 & 0xf000f00 |
          ((uVar3 >> 8 & 0x40004) * 0x3c00 & uVar7 << 4 ^ uVar7) & 0xf000f000;
  uVar3 = ((uVar4 & 0x40004) * 0x3c00 & uVar5 << 4 ^ uVar5) >> 0xc & 0xf000f | uVar2;
  uVar4 = (uVar2 >> 4 ^ uVar3) & 0x7030702;
  uVar4 = uVar4 << 4 ^ uVar3 ^ uVar4;
  uVar3 = (uVar4 >> 8 ^ uVar4) & 0x4e009e;
  uVar4 = uVar3 << 8 ^ uVar4 ^ uVar3;
  uVar3 = (uVar4 >> 0x10 ^ uVar4) & 0xd9d3;
  uVar4 = uVar3 << 0x10 ^ uVar4;
  uVar3 = uVar3 ^ uVar4;
  uVar4 = (uVar3 >> 4 ^ uVar4) & 0x5040004;
  uVar4 = uVar4 << 4 ^ uVar3 ^ uVar4;
  uVar3 = (uVar3 >> 1 ^ uVar4) & 0x4045015;
  return (LR)((ulong)(uVar3 * 2 ^ uVar4 ^ in.L ^ uVar3) << 0x20 | (ulong)in >> 0x20);
}

Assistant:

static inline LR des_round(LR in, const des_keysched *sched, size_t round)
{
    LR out;
    out.L = in.R;
    out.R = in.L ^ des_f(in.R, sched->k7531[round], sched->k6420[round]);
    return out;
}